

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treemodel.cpp
# Opt level: O1

UModelIndex * __thiscall
TreeModel::findByBase(UModelIndex *__return_storage_ptr__,TreeModel *this,UINT32 base)

{
  size_type sVar1;
  char cVar2;
  UINT32 UVar3;
  int iVar4;
  TreeModel *pTVar5;
  int iVar6;
  UModelIndex *this_00;
  int __c;
  bool bVar7;
  UModelIndex parentIndex;
  UModelIndex currentIndex;
  undefined1 local_e8 [16];
  TreeModel *local_d8;
  UByteArray local_c8;
  UModelIndex *local_a8;
  TreeModel *local_a0;
  int local_94;
  UModelIndex local_90;
  UByteArray local_78;
  uint64_t *local_58;
  UByteArray local_50;
  
  local_c8.d._M_dataplus._M_p = (pointer)0xffffffffffffffff;
  local_c8.d._M_string_length = 0;
  local_c8.d.field_2._M_allocated_capacity = 0;
  local_a0 = this;
  index((TreeModel *)local_e8,(char *)this,0);
  local_a8 = __return_storage_ptr__;
  local_58 = &__return_storage_ptr__->i;
  do {
    iVar6 = 0;
    if ((int)local_e8._4_4_ < 1) {
      pTVar5 = local_a0;
      if (local_d8 != (TreeModel *)0x0) {
        pTVar5 = (TreeModel *)(local_e8 + 8);
      }
      if ((int)local_e8._0_4_ < 0) {
        pTVar5 = local_a0;
      }
      if (local_e8._4_4_ != 0) {
        pTVar5 = local_a0;
      }
      iVar6 = (int)(pTVar5->rootItem->childItems).
                   super__List_base<TreeItem_*,_std::allocator<TreeItem_*>_>._M_impl._M_node._M_size
      ;
    }
    if (0 < iVar6) {
      __c = 0;
      do {
        index((TreeModel *)&local_90,(char *)local_d8,__c);
        this_00 = &local_90;
        UVar3 = TreeModel::base(local_a0,&local_90);
        header(&local_c8,(TreeModel *)this_00,&local_90);
        iVar4 = (int)local_c8.d._M_string_length;
        body(&local_78,(TreeModel *)this_00,&local_90);
        sVar1 = local_78.d._M_string_length;
        tail(&local_50,(TreeModel *)this_00,&local_90);
        local_94 = (int)local_50.d._M_string_length;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50.d._M_dataplus._M_p != &local_50.d.field_2) {
          operator_delete(local_50.d._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78.d._M_dataplus._M_p != &local_78.d.field_2) {
          operator_delete(local_78.d._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8.d._M_dataplus._M_p != &local_c8.d.field_2) {
          operator_delete(local_c8.d._M_dataplus._M_p);
        }
        bVar7 = (local_90.c | local_90.r) < 0;
        if ((local_90.m == (TreeModel *)0x0 || bVar7) ||
           (*(char *)(CONCAT44(local_90.i._4_4_,(undefined4)local_90.i) + 0xc9) != '\x01')) {
          if (base < UVar3) goto LAB_0012debe;
LAB_0012de91:
          if ((int)sVar1 + local_94 + UVar3 + iVar4 <= base) goto LAB_0012debe;
          local_d8 = local_90.m;
          local_e8._0_4_ = local_90.r;
          local_e8._4_4_ = local_90.c;
          local_e8[8] = local_90.i._0_1_;
          local_e8[9] = local_90.i._1_1_;
          local_e8._10_2_ = local_90.i._2_2_;
          local_e8._12_4_ = local_90.i._4_4_;
          iVar4 = 2;
          bVar7 = false;
        }
        else {
          if ((local_90.m != (TreeModel *)0x0 && !bVar7) &&
             (*(char *)(CONCAT44(local_90.i._4_4_,(undefined4)local_90.i) + 0xc9) == '\x01')) {
            parent((UModelIndex *)&local_c8,local_90.m,&local_90);
            cVar2 = '\0';
            if ((-1 < (int)(uint)local_c8.d._M_dataplus._M_p) &&
               ((-1 < (long)local_c8.d._M_dataplus._M_p &&
                ((TreeModel *)local_c8.d.field_2._M_allocated_capacity != (TreeModel *)0x0)))) {
              cVar2 = *(char *)(local_c8.d._M_string_length + 0xc9);
            }
            if ((UVar3 <= base) && (cVar2 == '\0')) goto LAB_0012de91;
          }
LAB_0012debe:
          iVar4 = 0;
          bVar7 = true;
        }
        if (!bVar7) goto LAB_0012ded7;
        __c = __c + 1;
      } while (iVar6 != __c);
    }
    iVar4 = 3;
LAB_0012ded7:
    if (iVar4 == 3) {
      local_78.d._M_dataplus._M_p = (pointer)0xffffffffffffffff;
      local_78.d._M_string_length = 0;
      local_78.d.field_2._M_allocated_capacity = 0;
      index((TreeModel *)&local_c8,(char *)local_a0,0);
      if (((((uint)local_c8.d._M_dataplus._M_p == local_e8._0_4_) &&
           (local_c8.d._M_string_length == CONCAT44(local_e8._12_4_,local_e8._8_4_))) &&
          (local_c8.d._M_dataplus._M_p._4_4_ == local_e8._4_4_)) &&
         ((TreeModel *)local_c8.d.field_2._M_allocated_capacity == local_d8)) {
        local_a8->r = -1;
        local_a8->c = -1;
        *local_58 = 0;
        local_58[1] = 0;
      }
      else {
        local_a8->m = local_d8;
        local_a8->r = local_e8._0_4_;
        local_a8->c = local_e8._4_4_;
        *(undefined4 *)&local_a8->i = local_e8._8_4_;
        *(undefined4 *)((long)&local_a8->i + 4) = local_e8._12_4_;
      }
      iVar4 = 1;
    }
    if (iVar4 != 2) {
      return local_a8;
    }
  } while( true );
}

Assistant:

UModelIndex TreeModel::findByBase(UINT32 base) const
{
    UModelIndex parentIndex = index(0,0);
    
goDeeper:
    int n = rowCount(parentIndex);
    for (int i = 0; i < n; i++) {
        UModelIndex currentIndex = parentIndex.model()->index(i, 0, parentIndex);
        
        UINT32 currentBase = this->base(currentIndex);
        UINT32 fullSize = (UINT32)(header(currentIndex).size() + body(currentIndex).size() + tail(currentIndex).size());
        if ((compressed(currentIndex) == false || (compressed(currentIndex) == true && compressed(currentIndex.parent()) == false)) // Base is meaningful only for true uncompressed items
            && currentBase <= base && base < currentBase + fullSize) { // Base must be in range [currentBase, currentBase + fullSize)
            // Found a better candidate
            parentIndex = currentIndex;
            goto goDeeper;
        }
    }
    
    return (parentIndex == index(0, 0) ? UModelIndex() : parentIndex);
}